

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall
IlmThread_3_2::anon_unknown_5::DefaultThreadPoolProvider::lockedFinish
          (DefaultThreadPoolProvider *this)

{
  element_type *peVar1;
  pointer ptVar2;
  pointer ptVar3;
  pointer ptVar4;
  long lVar5;
  long lVar6;
  
  LOCK();
  (((this->_data).
    super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->_stopping)._M_base._M_i = true;
  UNLOCK();
  peVar1 = (this->_data).
           super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ptVar2 = (peVar1->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar3 = (peVar1->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)ptVar3 - (long)ptVar2;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    lVar5 = lVar6;
    do {
      Semaphore::post(&((this->_data).
                        super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_taskSemaphore);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (ptVar3 != ptVar2) {
      do {
        std::thread::join();
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  peVar1 = (this->_data).
           super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ptVar2 = (peVar1->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar3 = (peVar1->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar4 = ptVar2;
  if (ptVar3 != ptVar2) {
    do {
      if ((ptVar4->_M_id)._M_thread != 0) {
        std::terminate();
      }
      ptVar4 = ptVar4 + 1;
    } while (ptVar4 != ptVar3);
    (peVar1->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar2;
  }
  LOCK();
  (peVar1->_threadCount).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (peVar1->_stopping)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void
DefaultThreadPoolProvider::lockedFinish ()
{
    _data->stop ();

    //
    // Signal enough times to allow all threads to stop.
    //
    // NB: we must do this as many times as we have threads.
    //
    // If there is still work in the queue, or this call happens "too
    // quickly", threads will not be waiting on the semaphore, so we
    // need to ensure the semaphore is at a count equal to the amount
    // of work left plus the number of threads to ensure exit of a
    // thread. There can be threads in a few states:
    //   - still starting up (successive calls to setNumThreads)
    //   - in the middle of processing a task / looping
    //   - waiting in the semaphore
    size_t curT = _data->_threads.size ();
    for (size_t i = 0; i != curT; ++i)
        _data->_taskSemaphore.post ();

    //
    // We should not need to check joinability, they should all, by
    // definition, be joinable (assuming normal start)
    //
    for (size_t i = 0; i != curT; ++i)
    {
        // This isn't quite right in that the thread may have actually
        // be in an exited / signalled state (needing the
        // WaitForSingleObject call), and so already have an exit code
        // (I think, but the docs are vague), but if we don't do the
        // join, the stl thread seems to then throw an exception. The
        // join should just return invalid handle and continue, and is
        // more of a windows bug... except maybe someone needs to work
        // around it...
        //#    ifdef TEST_FOR_WIN_THREAD_STATUS
        //
        //        // per OIIO issue #2038, on exit / dll unload, windows may
        //        // kill the thread, double check that it is still active prior
        //        // to joining.
        //        DWORD tstatus;
        //        if (GetExitCodeThread (_threads[i].native_handle (), &tstatus))
        //        {
        //            if (tstatus != STILL_ACTIVE) { continue; }
        //        }
        //#    endif

        _data->_threads[i].join ();
    }

    _data->_threads.clear ();

    _data->resetAtomics ();
}